

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::EdgeSensitivePathSuffixSyntax::EdgeSensitivePathSuffixSyntax
          (EdgeSensitivePathSuffixSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *outputs,Token polarityOperator,Token colon
          ,ExpressionSyntax *expr,Token closeParen)

{
  undefined4 uVar1;
  bool bVar2;
  NameSyntax *pNVar3;
  ExpressionSyntax *pEVar4;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  SyntaxNode *in_stack_00000018;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  undefined4 in_stack_ffffffffffffff78;
  SyntaxKind in_stack_ffffffffffffff7c;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *this_00;
  SyntaxNode *local_38 [3];
  undefined8 local_20;
  SyntaxNode *local_18;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&stack0x00000008;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDX;
  PathSuffixSyntax::PathSuffixSyntax((PathSuffixSyntax *)this_00,in_stack_ffffffffffffff7c);
  *(undefined8 *)(in_RDI + 1) = local_10;
  in_RDI[1].parent = local_8;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
            (this_00,(SeparatedSyntaxList<slang::syntax::NameSyntax> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  *(undefined8 *)(in_RDI + 4) = local_20;
  in_RDI[4].parent = local_18;
  in_RDI[4].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[5].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[5].field_0x4 = uVar1;
  local_38[0] = in_stack_00000018;
  not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
            ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RDI[5].parent,
             (ExpressionSyntax **)local_38);
  in_RDI[5].previewNode = (SyntaxNode *)child;
  *(ParentList **)(in_RDI + 6) = __end2.list;
  in_RDI[2].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x74d5f5);
  SeparatedSyntaxList<slang::syntax::NameSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::NameSyntax_*> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pNVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                          *)0x74d634);
    (pNVar3->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                *)this_00);
  }
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x74d664);
  (pEVar4->super_SyntaxNode).parent = in_RDI;
  return;
}

Assistant:

EdgeSensitivePathSuffixSyntax(Token openParen, const SeparatedSyntaxList<NameSyntax>& outputs, Token polarityOperator, Token colon, ExpressionSyntax& expr, Token closeParen) :
        PathSuffixSyntax(SyntaxKind::EdgeSensitivePathSuffix), openParen(openParen), outputs(outputs), polarityOperator(polarityOperator), colon(colon), expr(&expr), closeParen(closeParen) {
        this->outputs.parent = this;
        for (auto child : this->outputs)
            child->parent = this;
        this->expr->parent = this;
    }